

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O1

Constraint * create_with_side_effect_constraint(_func_void_void_ptr *callback,void *data)

{
  Constraint *pCVar1;
  
  pCVar1 = (Constraint *)malloc(0x80);
  pCVar1->destroy = destroy_empty_constraint;
  pCVar1->failure_message = failure_message_for;
  pCVar1->expected_value_name = (char *)0x0;
  pCVar1->parameter_name = (char *)0x0;
  pCVar1->actual_value_message = "\n\t\tactual value:\t\t\t[%ld]";
  pCVar1->expected_value_message = "\t\texpected value:\t\t\t[%ld]";
  pCVar1->type = CGREEN_CALL_CONSTRAINT;
  pCVar1->name = "cause side effect";
  pCVar1->side_effect_callback = callback;
  pCVar1->side_effect_data = data;
  pCVar1->execute = execute_sideeffect;
  return pCVar1;
}

Assistant:

Constraint *create_with_side_effect_constraint(void (*callback)(void *), void *data) {
    Constraint* constraint = create_constraint();
    constraint->type = CGREEN_CALL_CONSTRAINT;

    constraint->name = "cause side effect";
    constraint->side_effect_callback = callback;
    constraint->side_effect_data = data;
    constraint->execute = &execute_sideeffect;

    return constraint;
}